

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  ImGuiCond IVar1;
  ImDrawList *this;
  ImVec2 pos_00;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  ImGuiID IVar6;
  ImU32 IVar7;
  undefined7 extraout_var;
  ImGuiWindow *pIVar8;
  byte bVar9;
  undefined4 uVar10;
  ImGuiContext *g;
  uint uVar11;
  float fVar12;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar13;
  float fVar14;
  bool hovered;
  bool held;
  ImRect frame_bb;
  char name [16];
  ImVec2 size_expected;
  ImRect r_outer;
  ImVec2 pos;
  ImRect total_bb;
  bool local_111;
  float local_110;
  bool local_109;
  ImRect local_108;
  ImGuiID local_ec;
  ImVec2 local_e8 [3];
  undefined4 local_d0;
  ImGuiCond local_cc;
  undefined1 local_c8 [16];
  ImVec2 local_b0;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_98 [24];
  char *local_80;
  char *local_78;
  ImVec2 local_70;
  ImRect local_68;
  undefined1 local_58 [16];
  ImVec2 local_48;
  ImRect local_40;
  
  pIVar3 = GImGui;
  IVar1 = (GImGui->NextWindowData).SizeConstraintCond;
  (GImGui->NextWindowData).SizeConstraintCond = 0;
  pIVar8 = pIVar3->CurrentWindow;
  pIVar8->WriteAccessed = true;
  if (pIVar8->SkipItems == false) {
    local_78 = preview_value;
    if ((~flags & 0x60U) == 0) {
      __assert_fail("(flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui_widgets.cpp"
                    ,0x547,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
    }
    IVar6 = ImGuiWindow::GetID(pIVar8,label,(char *)0x0);
    local_110 = 0.0;
    if ((flags & 0x20U) == 0) {
      local_110 = GetFrameHeight();
    }
    IVar2 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_98._8_4_ = extraout_XMM0_Dc;
    local_98._0_4_ = IVar2.x;
    local_98._4_4_ = IVar2.y;
    local_98._12_4_ = extraout_XMM0_Dd;
    fVar12 = GetNextItemWidth();
    uStack_a4 = 0;
    uStack_a0 = 0;
    uStack_9c = 0;
    local_a8 = local_110;
    if ((flags & 0x40U) == 0) {
      local_a8 = fVar12;
      uStack_a4 = extraout_XMM0_Db;
      uStack_a0 = extraout_XMM0_Dc_00;
      uStack_9c = extraout_XMM0_Dd_00;
    }
    fVar12 = (pIVar3->Style).FramePadding.y;
    local_108.Max.x = (pIVar8->DC).CursorPos.x + local_a8;
    fVar13 = fVar12 + fVar12 + (float)local_98._4_4_ + (pIVar8->DC).CursorPos.y;
    local_108.Max.y = fVar13;
    local_108.Min = (pIVar8->DC).CursorPos;
    fVar14 = 0.0;
    if (0.0 < (float)local_98._0_4_) {
      fVar14 = (pIVar3->Style).ItemInnerSpacing.x + (float)local_98._0_4_;
    }
    local_40.Max.y = fVar13 + 0.0;
    local_40.Max.x = fVar14 + local_108.Max.x;
    local_ec = IVar6;
    local_80 = label;
    local_40.Min = local_108.Min;
    ItemSize(&local_40,fVar12);
    IVar6 = local_ec;
    bVar4 = ItemAdd(&local_40,local_ec,&local_108);
    if (bVar4) {
      local_cc = IVar1;
      bVar4 = ButtonBehavior(&local_108,IVar6,&local_111,&local_109,0);
      bVar5 = IsPopupOpen(IVar6);
      local_d0 = (undefined4)CONCAT71(extraout_var,bVar5);
      IVar7 = GetColorU32(local_111 + 7,1.0);
      local_c8 = ZEXT416((uint)local_108.Min.x);
      local_58 = ZEXT416((uint)local_108.Max.x);
      RenderNavHighlight(&local_108,IVar6,1);
      uVar11 = -(uint)((float)local_58._0_4_ - local_110 <= (float)local_c8._0_4_);
      local_c8._0_4_ = uVar11 & local_c8._0_4_ | ~uVar11 & (uint)((float)local_58._0_4_ - local_110)
      ;
      local_c8._4_4_ = local_58._4_4_ & local_c8._4_4_;
      local_c8._8_4_ = local_58._8_4_ & local_c8._8_4_;
      local_c8._12_4_ = local_58._12_4_ & local_c8._12_4_;
      if ((flags & 0x40U) == 0) {
        local_e8[0].y = local_108.Max.y;
        local_e8[0].x = (float)local_c8._0_4_;
        ImDrawList::AddRectFilled
                  (pIVar8->DrawList,&local_108.Min,local_e8,IVar7,(pIVar3->Style).FrameRounding,5);
      }
      uVar10 = local_d0;
      bVar9 = (byte)local_d0;
      if ((flags & 0x20U) == 0) {
        this = pIVar8->DrawList;
        local_e8[0].y = local_108.Min.y;
        local_e8[0].x = (float)local_c8._0_4_;
        IVar7 = GetColorU32(((local_111 | bVar9) & 1) + 0x15,1.0);
        ImDrawList::AddRectFilled
                  (this,local_e8,&local_108.Max,IVar7,(pIVar3->Style).FrameRounding,
                   (uint)(local_a8 <= local_110) * 5 + 10);
        fVar12 = (pIVar3->Style).FramePadding.y;
        IVar2.y = fVar12 + local_108.Min.y;
        IVar2.x = (float)local_c8._0_4_ + fVar12;
        RenderArrow(IVar2,3,1.0);
      }
      RenderFrameBorder(local_108.Min,local_108.Max,(pIVar3->Style).FrameRounding);
      if (local_78 != (char *)0x0 && (char)((flags & 0x40U) >> 6) == '\0') {
        local_e8[0].y = local_108.Min.y + (pIVar3->Style).FramePadding.y;
        local_e8[0].x = local_108.Min.x + (pIVar3->Style).FramePadding.x;
        local_68.Min.y = local_108.Max.y;
        local_68.Min.x = (float)local_c8._0_4_;
        local_b0.x = 0.0;
        local_b0.y = 0.0;
        RenderTextClipped(local_e8,&local_68.Min,local_78,(char *)0x0,(ImVec2 *)0x0,&local_b0,
                          (ImRect *)0x0);
      }
      IVar1 = local_cc;
      IVar6 = local_ec;
      if (0.0 < (float)local_98._0_4_) {
        pos_00.y = local_108.Min.y + (pIVar3->Style).FramePadding.y;
        pos_00.x = local_108.Max.x + (pIVar3->Style).ItemInnerSpacing.x;
        RenderText(pos_00,local_80,(char *)0x0,true);
      }
      if (!bVar4) {
        bVar9 = bVar9 | pIVar3->NavActivateId != IVar6;
      }
      if (bVar9 == 0) {
        if ((pIVar8->DC).NavLayerCurrent == ImGuiNavLayer_Main) {
          pIVar8->NavLastIds[0] = IVar6;
        }
        OpenPopupEx(IVar6);
        uVar10 = 1;
      }
      if ((char)uVar10 == '\0') {
        return false;
      }
      if (IVar1 == 0) {
        uVar11 = flags | 4;
        if ((flags & 0x1eU) != 0) {
          uVar11 = flags;
        }
        flags = uVar11;
        uVar11 = (flags & 0x1eU) - 1;
        if ((flags & 0x1eU ^ uVar11) <= uVar11) {
          __assert_fail("ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_)",
                        "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui_widgets.cpp"
                        ,0x57e,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)"
                       );
        }
        uVar11 = 8;
        if (((flags & 4U) == 0) && (uVar11 = 4, (flags & 2U) == 0)) {
          uVar11 = -(uint)((flags & 8U) == 0) | 0x14;
        }
        local_e8[0].y = 0.0;
        local_e8[0].x = local_a8;
        if ((int)uVar11 < 1) {
          fVar12 = 3.4028235e+38;
        }
        else {
          fVar12 = (GImGui->Style).WindowPadding.y;
          fVar13 = (GImGui->Style).ItemSpacing.y;
          fVar12 = fVar12 + fVar12 + ((float)(int)uVar11 * (GImGui->FontSize + fVar13) - fVar13);
        }
        local_68.Min.y = fVar12;
        local_68.Min.x = 3.4028235e+38;
        SetNextWindowSizeConstraints(local_e8,&local_68.Min,(ImGuiSizeCallback)0x0,(void *)0x0);
      }
      else {
        (pIVar3->NextWindowData).SizeConstraintCond = IVar1;
        fVar12 = (pIVar3->NextWindowData).SizeConstraintRect.Min.x;
        uVar11 = -(uint)(local_a8 <= fVar12);
        (pIVar3->NextWindowData).SizeConstraintRect.Min.x =
             (float)(~uVar11 & (uint)local_a8 | (uint)fVar12 & uVar11);
      }
      ImFormatString((char *)local_e8,0x10,"##Combo_%02d",
                     (ulong)(uint)(pIVar3->BeginPopupStack).Size);
      pIVar8 = FindWindowByName((char *)local_e8);
      if ((pIVar8 != (ImGuiWindow *)0x0) && (pIVar8->WasActive == true)) {
        local_b0 = CalcWindowExpectedSize(pIVar8);
        if ((flags & 1U) != 0) {
          pIVar8->AutoPosLastDirection = 0;
        }
        local_68 = GetWindowAllowedExtentRect(pIVar8);
        local_70.y = local_108.Max.y;
        local_70.x = local_108.Min.x;
        local_48 = FindBestWindowPosForPopupEx
                             (&local_70,&local_b0,&pIVar8->AutoPosLastDirection,&local_68,&local_108
                              ,ImGuiPopupPositionPolicy_ComboBox);
        local_70.x = 0.0;
        local_70.y = 0.0;
        SetNextWindowPos(&local_48,0,&local_70);
      }
      local_68.Min.y = (pIVar3->Style).WindowPadding.y;
      local_68.Min.x = (pIVar3->Style).FramePadding.x;
      PushStyleVar(1,&local_68.Min);
      bVar4 = Begin((char *)local_e8,(bool *)0x0,0x4000143);
      PopStyleVar(1);
      if (bVar4) {
        return (bool)(char)uVar10;
      }
      EndPopup();
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui_widgets.cpp"
                    ,0x59d,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
    }
  }
  return false;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    ImGuiCond backup_next_window_size_constraint = g.NextWindowData.SizeConstraintCond;
    g.NextWindowData.SizeConstraintCond = 0;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float expected_w = GetNextItemWidth();
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : expected_w;
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);
    bool popup_open = IsPopupOpen(id);

    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(frame_bb.Min.x, frame_bb.Max.x - arrow_size);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(value_x2, frame_bb.Max.y), frame_col, style.FrameRounding, ImDrawCornerFlags_Left);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        window->DrawList->AddRectFilled(ImVec2(value_x2, frame_bb.Min.y), frame_bb.Max, GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button), style.FrameRounding, (w <= arrow_size) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Right);
        RenderArrow(ImVec2(value_x2 + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), ImGuiDir_Down);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
        RenderTextClipped(frame_bb.Min + style.FramePadding, ImVec2(value_x2, frame_bb.Max.y), preview_value, NULL, NULL, ImVec2(0.0f,0.0f));
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(id);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (backup_next_window_size_constraint)
    {
        g.NextWindowData.SizeConstraintCond = backup_next_window_size_constraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth

    // Peak into expected window size so we can position it
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            ImVec2 size_expected = CalcWindowExpectedSize(popup_window);
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left;
            ImRect r_outer = GetWindowAllowedExtentRect(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // Horizontally align ourselves with the framed text
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings;
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}